

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_is_reg(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  stat st;
  stat sStack_b8;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,&sStack_b8);
  if ((iVar1 == 0) && ((sStack_b8.st_mode & 0xf000) == 0x8000)) {
    if ((sStack_b8.st_mode & 0xfff) == mode || mode < L'\0') {
      return L'\x01';
    }
    failure_start(file,line,"File %s has wrong mode",pathname);
    logprintf("  Expected: 0%3o\n",(ulong)(uint)mode);
    file = "  Found: 0%3o\n";
    logprintf("  Found: 0%3o\n",(ulong)(sStack_b8.st_mode & 0xfff));
  }
  else {
    failure_start(file,line,"File should exist: %s",pathname);
  }
  failure_finish(file);
  return L'\0';
}

Assistant:

int
assertion_is_reg(const char *file, int line, const char *pathname, int mode)
{
	struct stat st;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
#endif
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0 || !S_ISREG(st.st_mode)) {
		failure_start(file, line, "File should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	/* Windows doesn't handle permissions the same way as POSIX,
	 * so just ignore the mode tests. */
	/* TODO: Can we do better here? */
	if (mode >= 0 && (mode_t)mode != (st.st_mode & 07777)) {
		failure_start(file, line, "File %s has wrong mode", pathname);
		logprintf("  Expected: 0%3o\n", mode);
		logprintf("  Found: 0%3o\n", st.st_mode & 07777);
		failure_finish(NULL);
		return (0);
	}
#endif
	return (1);
}